

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

StreamingConcatenationExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::StreamingConcatenationExpressionSyntax,slang::syntax::StreamingConcatenationExpressionSyntax_const&>
          (BumpAllocator *this,StreamingConcatenationExpressionSyntax *args)

{
  StreamingConcatenationExpressionSyntax *pSVar1;
  StreamingConcatenationExpressionSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pSVar1 = (StreamingConcatenationExpressionSyntax *)
           allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::StreamingConcatenationExpressionSyntax::StreamingConcatenationExpressionSyntax
            (in_RSI,pSVar1);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }